

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O1

int secp256k1_modinv64_mul_cmp_62
              (secp256k1_modinv64_signed62 *a,int alen,secp256k1_modinv64_signed62 *b,int64_t factor
              )

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  secp256k1_modinv64_signed62 *a_00;
  ulong uVar10;
  secp256k1_modinv64_signed62 *psVar11;
  secp256k1_modinv64_signed62 *psVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  secp256k1_modinv64_signed62 bm;
  secp256k1_modinv64_signed62 am;
  secp256k1_modinv64_signed62 local_68;
  secp256k1_modinv64_signed62 local_40;
  
  a_00 = &local_68;
  secp256k1_modinv64_mul_62(&local_40,a,alen,1);
  secp256k1_modinv64_mul_62(&local_68,b,5,factor);
  lVar3 = 0;
  while ((ulong)local_40.v[lVar3] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)local_68.v[lVar3]) goto LAB_0011c6c3;
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      uVar1 = 4;
      while( true ) {
        if (local_40.v[uVar1] < local_68.v[uVar1]) {
          return -1;
        }
        if (local_68.v[uVar1] < local_40.v[uVar1]) break;
        bVar16 = uVar1 == 0;
        uVar1 = uVar1 - 1;
        if (bVar16) {
          return 0;
        }
      }
      return 1;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0011c6c3:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  psVar12 = (secp256k1_modinv64_signed62 *)a_00->v[0];
  uVar6 = a_00->v[1];
  uVar8 = a_00->v[2];
  uVar9 = a_00->v[3];
  lVar3 = a_00->v[4];
  lVar4 = 0;
  do {
    if (a_00->v[lVar4] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
      psVar11 = psVar12;
LAB_0011c8ed:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0011c8f2;
    }
    psVar11 = psVar12;
    if (0x3fffffffffffffff < a_00->v[lVar4]) goto LAB_0011c8ed;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  psVar11 = a_00;
  iVar2 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar2 < 1) {
LAB_0011c8f2:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0011c8f7:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0011c8fc:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    psVar11 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar2) goto LAB_0011c8f7;
    uVar5 = lVar3 >> 0x3f;
    uVar15 = (long)b >> 0x3f;
    uVar7 = ((long)psVar12->v + (uVar5 & 0xfffffffefffffc2f) ^ uVar15) - uVar15;
    uVar10 = ((long)uVar7 >> 0x3e) + ((uVar6 ^ uVar15) - uVar15);
    uVar13 = ((long)uVar10 >> 0x3e) + ((uVar8 ^ uVar15) - uVar15);
    uVar14 = ((long)uVar13 >> 0x3e) + ((uVar9 ^ uVar15) - uVar15);
    lVar3 = ((long)uVar14 >> 0x3e) + (((uVar5 & 0x100) + lVar3 ^ uVar15) - uVar15);
    uVar9 = lVar3 >> 0x3f;
    uVar6 = (uVar9 & 0xfffffffefffffc2f) + (uVar7 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar6 >> 0x3e) + (uVar10 & 0x3fffffffffffffff);
    uVar5 = ((long)uVar8 >> 0x3e) + (uVar13 & 0x3fffffffffffffff);
    uVar7 = ((long)uVar5 >> 0x3e) + (uVar14 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar7 >> 0x3e) + (uVar9 & 0x100) + lVar3;
    psVar11 = (secp256k1_modinv64_signed62 *)(uVar7 & 0x3fffffffffffffff);
    a_00->v[0] = uVar6 & 0x3fffffffffffffff;
    a_00->v[1] = uVar8 & 0x3fffffffffffffff;
    a_00->v[2] = uVar5 & 0x3fffffffffffffff;
    a_00->v[3] = (int64_t)psVar11;
    a_00->v[4] = uVar9;
    if (0x3fffffffffffffff < uVar9) goto LAB_0011c8fc;
    psVar11 = a_00;
    iVar2 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar2) {
      iVar2 = secp256k1_modinv64_mul_cmp_62(a_00,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar2 < 0) {
        return iVar2;
      }
      goto LAB_0011c906;
    }
  }
  a_00 = psVar11;
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0011c906:
  secp256k1_modinv64_normalize_62_cold_1();
  if ((long)a_00 < 1) {
    a_00 = (secp256k1_modinv64_signed62 *)-(long)a_00;
  }
  return (int)a_00;
}

Assistant:

static int secp256k1_modinv64_mul_cmp_62(const secp256k1_modinv64_signed62 *a, int alen, const secp256k1_modinv64_signed62 *b, int64_t factor) {
    int i;
    secp256k1_modinv64_signed62 am, bm;
    secp256k1_modinv64_mul_62(&am, a, alen, 1); /* Normalize all but the top limb of a. */
    secp256k1_modinv64_mul_62(&bm, b, 5, factor);
    for (i = 0; i < 4; ++i) {
        /* Verify that all but the top limb of a and b are normalized. */
        VERIFY_CHECK(am.v[i] >> 62 == 0);
        VERIFY_CHECK(bm.v[i] >> 62 == 0);
    }
    for (i = 4; i >= 0; --i) {
        if (am.v[i] < bm.v[i]) return -1;
        if (am.v[i] > bm.v[i]) return 1;
    }
    return 0;
}